

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::
add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,WeightedOption weightedOption,
          WeightedOption rest)

{
  WeightedOption weightedOption_00;
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  ulong local_40;
  size_t i;
  FeatureOptions<wasm::Type> *this_local;
  WeightedOption rest_local;
  WeightedOption weightedOption_local;
  FeatureSet feature_local;
  
  weightedOption_local.option.id = weightedOption.weight;
  rest_local.weight = (size_t)weightedOption.option.id;
  rest_local.option.id = rest.weight;
  weightedOption_local.weight._4_4_ = feature.features;
  for (local_40 = 0; local_40 < weightedOption_local.option.id; local_40 = local_40 + 1) {
    this_00 = std::
              map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
              ::operator[](&this->options,(key_type *)((long)&weightedOption_local.weight + 4));
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              (this_00,(value_type *)&rest_local.weight);
  }
  weightedOption_00.weight = rest_local.option.id;
  weightedOption_00.option.id = rest.option.id.id;
  pFVar1 = add<>(this,weightedOption_local.weight._4_4_,weightedOption_00);
  return pFVar1;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }